

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

int qEncodeNtlmString(QNtlmBuffer *buf,int offset,QString *s,bool unicode)

{
  quint16 qVar1;
  undefined3 in_register_00000009;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (CONCAT31(in_register_00000009,unicode) == 0) {
    QString::toLatin1_helper((QString *)&local_40);
    buf->len = (quint16)(uint)local_40.size;
    buf->maxLen = (quint16)(uint)local_40.size;
    uVar3 = offset + 1U & 0xfffffffe;
    buf->offset = uVar3;
    iVar4 = ((uint)local_40.size & 0xffff) + uVar3;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
  }
  else {
    uVar3 = (int)(s->d).size * 2;
    qVar1 = (quint16)uVar3;
    buf->len = qVar1;
    buf->maxLen = qVar1;
    uVar2 = offset + 1U & 0xfffffffe;
    buf->offset = uVar2;
    iVar4 = (uVar3 & 0xffff) + uVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

static int qEncodeNtlmString(QNtlmBuffer& buf, int offset, const QString& s, bool unicode)
{
    if (!unicode)
        return qEncodeNtlmBuffer(buf, offset, s.toLatin1());
    buf.len = 2 * s.size();
    buf.maxLen = buf.len;
    buf.offset = (offset + 1) & ~1;
    return buf.offset + buf.len;
}